

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2291::Reactor::dictionaryItem(Reactor *this,string *key,JSON *value)

{
  bool bVar1;
  ostream *poVar2;
  JSON *value_local;
  string *key_local;
  Reactor *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"dictionary item: ");
  poVar2 = std::operator<<(poVar2,(string *)key);
  std::operator<<(poVar2," -> ");
  printItem(this,value);
  bVar1 = std::operator==(key,"keep");
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool
Reactor::dictionaryItem(std::string const& key, JSON const& value)
{
    std::cout << "dictionary item: " << key << " -> ";
    printItem(value);
    if (key == "keep") {
        return false;
    }
    return true;
}